

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  int in_EAX;
  uint uVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  undefined1 uVar11;
  int iVar12;
  uint uVar13;
  byte *local_40;
  char *local_38;
  
  lVar7 = (long)end - (long)ptr;
  if (lVar7 < 2) {
    return -1;
  }
  local_38 = end + -2;
  local_40 = (byte *)ptr;
LAB_004e7c4d:
  bVar1 = *local_40;
  if (bVar1 < 0xdc) {
    uVar11 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar11 = *(undefined1 *)((long)enc[1].scanners + (ulong)local_40[1]);
      }
      else {
LAB_004e7c9c:
        uVar11 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar11 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (local_40[1] < 0xfe)) goto LAB_004e7c9c;
    uVar11 = 0;
  }
  switch(uVar11) {
  case 6:
    if (lVar7 == 2) {
      return -2;
    }
    break;
  case 7:
    if (lVar7 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    lVar7 = (long)local_38 - (long)local_40;
    pbVar8 = local_40;
    do {
      local_40 = pbVar8 + 2;
      iVar9 = 1;
      if (lVar7 < 2) {
        in_EAX = -1;
      }
      else {
        bVar1 = *local_40;
        if (bVar1 < 0xdc) {
          uVar13 = 7;
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              uVar13 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar8[3]);
            }
            else {
LAB_004e7d39:
              uVar13 = 0x1d;
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          uVar13 = 8;
        }
        else if ((bVar1 != 0xff) || (uVar13 = 0, pbVar8[3] < 0xfe)) goto LAB_004e7d39;
        iVar9 = 5;
        if ((uVar13 != 0xe) &&
           ((0x15 < uVar13 || (iVar9 = 0, (0x200600U >> (uVar13 & 0x1f) & 1) == 0)))) {
          *nextTokPtr = (char *)local_40;
          in_EAX = 0;
          iVar9 = 1;
        }
      }
      lVar7 = lVar7 + -2;
      pbVar8 = local_40;
    } while (iVar9 == 0);
    if (iVar9 == 1) {
      return in_EAX;
    }
  case 0xe:
    local_40 = local_40 + 2;
    for (lVar7 = (long)end - (long)local_40; 1 < lVar7; lVar7 = lVar7 + -2) {
      bVar1 = *local_40;
      if (bVar1 < 0xdc) {
        uVar13 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar13 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
          }
          else {
LAB_004e7dec:
            uVar13 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar13 = 8;
      }
      else if ((bVar1 != 0xff) || (uVar13 = 0, local_40[1] < 0xfe)) goto LAB_004e7dec;
      if ((uVar13 & 0xfffffffe) == 0xc) {
        local_40 = local_40 + 2;
        goto LAB_004e7e6a;
      }
      if ((0x15 < uVar13) || ((0x200600U >> (uVar13 & 0x1f) & 1) == 0)) {
        *nextTokPtr = (char *)local_40;
        in_EAX = 0;
        goto LAB_004e7e2d;
      }
      local_40 = local_40 + 2;
    }
    in_EAX = -1;
LAB_004e7e2d:
    bVar2 = true;
    goto LAB_004e8161;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_004e7cb6_caseD_16;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(local_40[1] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5
                         )) >> (local_40[1] & 0x1f) & 1) == 0) break;
    goto switchD_004e7cb6_caseD_16;
  }
  *nextTokPtr = (char *)local_40;
  return 0;
switchD_004e7cb6_caseD_16:
  local_40 = local_40 + 2;
  goto LAB_004e8169;
LAB_004e7e6a:
  do {
    lVar7 = (long)end - (long)local_40;
    iVar9 = -1;
    if (lVar7 < 2) {
LAB_004e7efa:
      bVar2 = true;
      iVar12 = 1;
      goto LAB_004e7f12;
    }
    bVar1 = *local_40;
    if (bVar1 < 0xdc) {
      uVar5 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
        }
        else {
LAB_004e7ed2:
          uVar5 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar5 = 8;
    }
    else if ((bVar1 != 0xff) || (uVar5 = 0, local_40[1] < 0xfe)) goto LAB_004e7ed2;
    if (uVar5 == uVar13) {
      iVar12 = 0xb;
LAB_004e7f10:
      bVar2 = false;
      iVar9 = in_EAX;
    }
    else {
      switch(uVar5) {
      case 0:
      case 1:
      case 2:
      case 8:
        *nextTokPtr = (char *)local_40;
        iVar9 = 0;
        goto LAB_004e7efa;
      case 3:
        iVar6 = big2_scanRef(enc,(char *)(local_40 + 2),end,(char **)&local_40);
        bVar2 = false;
        iVar12 = 0;
        iVar9 = in_EAX;
        if (iVar6 < 1) {
          if (iVar6 == 0) {
            *nextTokPtr = (char *)local_40;
          }
          bVar2 = true;
          iVar12 = 1;
          iVar9 = iVar6;
        }
        break;
      default:
        local_40 = local_40 + 2;
LAB_004e7f07:
        iVar12 = 0;
        goto LAB_004e7f10;
      case 6:
        bVar2 = true;
        iVar12 = 1;
        iVar9 = -2;
        if (lVar7 != 2) {
          local_40 = local_40 + 3;
          goto LAB_004e7f07;
        }
        break;
      case 7:
        bVar2 = true;
        iVar12 = 1;
        iVar9 = -2;
        if (3 < lVar7) {
          local_40 = local_40 + 4;
          goto LAB_004e7f07;
        }
      }
    }
LAB_004e7f12:
    in_EAX = iVar9;
  } while (iVar12 == 0);
  if (iVar12 != 0xb) goto LAB_004e8161;
  pbVar8 = local_40 + 2;
  bVar2 = true;
  bVar3 = true;
  if ((long)end - (long)pbVar8 < 2) {
LAB_004e8155:
    local_40 = pbVar8;
    in_EAX = -1;
  }
  else {
    bVar1 = *pbVar8;
    if (bVar1 < 0xdc) {
      uVar13 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar13 = (uint)*(byte *)((long)enc[1].scanners + (ulong)local_40[3]);
        }
        else {
LAB_004e8059:
          uVar13 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar13 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (local_40[3] < 0xfe)) goto LAB_004e8059;
      uVar13 = 0;
    }
    if (uVar13 < 0x11) {
      if (uVar13 - 9 < 2) {
LAB_004e809e:
        uVar10 = (long)end - (long)(local_40 + 4);
        pbVar8 = local_40 + 4;
        if (1 < (long)uVar10) {
          pbVar4 = local_40 + 6;
LAB_004e80bb:
          pbVar8 = pbVar4;
          bVar1 = pbVar8[-2];
          if (bVar1 < 0xdc) {
            uVar11 = 7;
            if (3 < bVar1 - 0xd8) {
              if (bVar1 == 0) {
                uVar11 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar8[-1]);
              }
              else {
LAB_004e811c:
                uVar11 = 0x1d;
              }
            }
          }
          else if (bVar1 - 0xdc < 4) {
            uVar11 = 8;
          }
          else {
            if ((bVar1 != 0xff) || (pbVar8[-1] < 0xfe)) goto LAB_004e811c;
            uVar11 = 0;
          }
          switch(uVar11) {
          default:
            pbVar8 = pbVar8 + -2;
            goto LAB_004e818c;
          case 6:
            local_40 = pbVar8 + -2;
            in_EAX = -2;
            pbVar8 = local_40;
            if (uVar10 == 2) goto LAB_004e8161;
            goto LAB_004e818c;
          case 7:
            local_40 = pbVar8 + -2;
            in_EAX = -2;
            pbVar8 = local_40;
            if (uVar10 < 4) goto LAB_004e8161;
            goto LAB_004e818c;
          case 9:
          case 10:
          case 0x15:
            goto switchD_004e8134_caseD_9;
          case 0xb:
            local_40 = pbVar8 + -2;
            goto LAB_004e8076;
          case 0x11:
            pbVar8 = pbVar8 + -2;
            goto LAB_004e81e4;
          case 0x16:
          case 0x18:
            break;
          case 0x1d:
            local_40 = pbVar8 + -2;
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(pbVar8[-1] >> 3 & 0x1c |
                                 (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
                 (pbVar8[-1] & 0x1f) & 1) == 0) {
              *nextTokPtr = (char *)local_40;
              goto LAB_004e818f;
            }
          }
          bVar2 = false;
          local_40 = pbVar8;
          goto LAB_004e8161;
        }
        goto LAB_004e8155;
      }
      local_40 = pbVar8;
      if (uVar13 == 0xb) {
LAB_004e8076:
        *nextTokPtr = (char *)(local_40 + 2);
        in_EAX = 1;
        goto LAB_004e8161;
      }
    }
    else {
      if (uVar13 == 0x11) {
LAB_004e81e4:
        local_40 = pbVar8;
        pbVar8 = local_40 + 2;
        bVar2 = bVar3;
        if ((long)end - (long)pbVar8 < 2) {
          in_EAX = -1;
          local_40 = pbVar8;
        }
        else if ((*pbVar8 == 0) && (local_40[3] == 0x3e)) {
          *nextTokPtr = (char *)(local_40 + 4);
          in_EAX = 3;
          local_40 = pbVar8;
        }
        else {
          *nextTokPtr = (char *)pbVar8;
          in_EAX = 0;
          local_40 = pbVar8;
        }
        goto LAB_004e8161;
      }
      if (uVar13 == 0x15) goto LAB_004e809e;
    }
LAB_004e818c:
    local_40 = pbVar8;
    *nextTokPtr = (char *)local_40;
LAB_004e818f:
    in_EAX = 0;
  }
LAB_004e8161:
  if (bVar2) {
    return in_EAX;
  }
LAB_004e8169:
  lVar7 = (long)end - (long)local_40;
  if (lVar7 < 2) {
    return -1;
  }
  goto LAB_004e7c4d;
switchD_004e8134_caseD_9:
  uVar10 = uVar10 - 2;
  pbVar4 = pbVar8 + 2;
  if ((long)uVar10 < 2) goto LAB_004e8155;
  goto LAB_004e80bb;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}